

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

MutableStringView __thiscall
Corrade::Containers::String::findAnyOr(String *this,StringView characters,char *fail)

{
  StringView characters_00;
  BasicStringView<char> BVar1;
  MutableStringView MVar2;
  BasicStringView<char> local_48;
  char *local_38;
  char *fail_local;
  String *this_local;
  StringView characters_local;
  
  characters_local._data = (char *)characters._sizePlusFlags;
  this_local = (String *)characters._data;
  local_38 = fail;
  fail_local = (char *)this;
  BasicStringView<char>::BasicStringView(&local_48,this);
  characters_00._sizePlusFlags = (size_t)characters_local._data;
  characters_00._data = (char *)this_local;
  BVar1 = BasicStringView<char>::findAnyOr(&local_48,characters_00,local_38);
  MVar2._data = BVar1._data;
  MVar2._sizePlusFlags = BVar1._sizePlusFlags;
  return MVar2;
}

Assistant:

MutableStringView String::findAnyOr(const StringView characters, char* fail) {
    return MutableStringView{*this}.findAnyOr(characters, fail);
}